

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

HierarchicalReferenceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::HierarchicalReferenceExpression,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Symbol *args,Type *args_1,SourceRange *args_2)

{
  HierarchicalReferenceExpression *this_00;
  SourceRange *args_local_2;
  Type *args_local_1;
  Symbol *args_local;
  BumpAllocator *this_local;
  
  this_00 = (HierarchicalReferenceExpression *)allocate(this,0x38,8);
  ast::HierarchicalReferenceExpression::HierarchicalReferenceExpression(this_00,args,args_1,*args_2)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }